

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConvexAlgorithm.cpp
# Opt level: O3

void __thiscall
btConvexConvexAlgorithm::btConvexConvexAlgorithm
          (btConvexConvexAlgorithm *this,btPersistentManifold *mf,
          btCollisionAlgorithmConstructionInfo *ci,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btVoronoiSimplexSolver *simplexSolver,
          btConvexPenetrationDepthSolver *pdSolver,int numPerturbationIterations,
          int minimumPointsPerturbationThreshold)

{
  btActivatingCollisionAlgorithm::btActivatingCollisionAlgorithm
            (&this->super_btActivatingCollisionAlgorithm,ci,body0Wrap,body1Wrap);
  (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm._vptr_btCollisionAlgorithm
       = (_func_int **)&PTR__btConvexConvexAlgorithm_0021c388;
  this->m_simplexSolver = simplexSolver;
  this->m_pdSolver = pdSolver;
  this->m_ownManifold = false;
  this->m_manifoldPtr = mf;
  this->m_lowLevelOfDetail = false;
  this->m_numPerturbationIterations = numPerturbationIterations;
  this->m_minimumPointsPerturbationThreshold = minimumPointsPerturbationThreshold;
  return;
}

Assistant:

btConvexConvexAlgorithm::btConvexConvexAlgorithm(btPersistentManifold* mf,const btCollisionAlgorithmConstructionInfo& ci,const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,btSimplexSolverInterface* simplexSolver, btConvexPenetrationDepthSolver* pdSolver,int numPerturbationIterations, int minimumPointsPerturbationThreshold)
: btActivatingCollisionAlgorithm(ci,body0Wrap,body1Wrap),
m_simplexSolver(simplexSolver),
m_pdSolver(pdSolver),
m_ownManifold (false),
m_manifoldPtr(mf),
m_lowLevelOfDetail(false),
#ifdef USE_SEPDISTANCE_UTIL2
m_sepDistance((static_cast<btConvexShape*>(body0->getCollisionShape()))->getAngularMotionDisc(),
			  (static_cast<btConvexShape*>(body1->getCollisionShape()))->getAngularMotionDisc()),
#endif
m_numPerturbationIterations(numPerturbationIterations),
m_minimumPointsPerturbationThreshold(minimumPointsPerturbationThreshold)
{
	(void)body0Wrap;
	(void)body1Wrap;
}